

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::scale(btSoftBody *this,btVector3 *scl)

{
  Node *pNVar1;
  long lVar2;
  long lVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  btDbvtVolume local_50;
  
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  lVar2 = (long)(this->m_nodes).m_size;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pNVar1 = (this->m_nodes).m_data;
      fVar4 = scl->m_floats[0] * *(float *)((long)(pNVar1->m_x).m_floats + lVar3);
      *(float *)((long)(pNVar1->m_x).m_floats + lVar3) = fVar4;
      fVar5 = scl->m_floats[1] * *(float *)((long)(pNVar1->m_x).m_floats + lVar3 + 4);
      *(float *)((long)(pNVar1->m_x).m_floats + lVar3 + 4) = fVar5;
      fVar6 = scl->m_floats[2] * *(float *)((long)(pNVar1->m_x).m_floats + lVar3 + 8);
      *(float *)((long)(pNVar1->m_x).m_floats + lVar3 + 8) = fVar6;
      *(float *)((long)(pNVar1->m_q).m_floats + lVar3) =
           scl->m_floats[0] * *(float *)((long)(pNVar1->m_q).m_floats + lVar3);
      *(float *)((long)(pNVar1->m_q).m_floats + lVar3 + 4) =
           scl->m_floats[1] * *(float *)((long)(pNVar1->m_q).m_floats + lVar3 + 4);
      *(float *)((long)(pNVar1->m_q).m_floats + lVar3 + 8) =
           scl->m_floats[2] * *(float *)((long)(pNVar1->m_q).m_floats + lVar3 + 8);
      local_50.mi.m_floats[1] = fVar5 - extraout_XMM0_Da;
      local_50.mi.m_floats[0] = fVar4 - extraout_XMM0_Da;
      local_50.mi.m_floats[2] = fVar6 - extraout_XMM0_Da;
      local_50.mi.m_floats[3] = 0.0;
      local_50.mx.m_floats[1] = extraout_XMM0_Da + fVar5;
      local_50.mx.m_floats[0] = extraout_XMM0_Da + fVar4;
      local_50.mx.m_floats[2] = extraout_XMM0_Da + fVar6;
      local_50.mx.m_floats[3] = 0.0;
      btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar1->m_n + 1) + lVar3 + 8),&local_50
                    );
      lVar3 = lVar3 + 0x78;
    } while (lVar2 * 0x78 - lVar3 != 0);
  }
  updateNormals(this);
  updateBounds(this);
  updateConstants(this);
  return;
}

Assistant:

void			btSoftBody::scale(const btVector3& scl)
{

	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x*=scl;
		n.m_q*=scl;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
}